

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistogramBasedDistribution.cpp
# Opt level: O2

unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
 __thiscall
HistogramBasedDistribution::toDistribution
          (HistogramBasedDistribution *this,double tailCutoff,int *offset)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  int *piVar4;
  vector<double,_std::allocator<double>_> *this_00;
  ulong uVar5;
  int iVar6;
  int *in_RDX;
  int *piVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  uint local_50;
  
  iVar11 = offset[2];
  piVar7 = *(int **)(offset + 4);
  uVar5 = *(long *)(offset + 6) - (long)piVar7 >> 4;
  uVar10 = 1;
  lVar9 = 0;
  dVar14 = 0.0;
  piVar4 = piVar7;
  do {
    dVar13 = dVar14;
    if (uVar5 + lVar9 == 0) {
      local_50 = 0xffffffff;
      goto LAB_00192e73;
    }
    iVar12 = offset[3];
    if (uVar10 < uVar5) {
      iVar12 = piVar4[4] + -1;
    }
    iVar8 = *piVar4;
    pdVar1 = (double *)(piVar4 + 2);
    dVar14 = (double)((iVar12 - iVar8) + 1) * *pdVar1 + dVar13;
    lVar9 = lVar9 + -1;
    uVar10 = uVar10 + 1;
    piVar4 = piVar4 + 4;
  } while (dVar14 <= tailCutoff);
  iVar11 = iVar8 + (int)((tailCutoff - dVar13) / *pdVar1);
  local_50 = ~(uint)lVar9;
LAB_00192e73:
  piVar7 = piVar7 + uVar5 * 4;
  uVar10 = uVar5;
  dVar14 = 0.0;
  do {
    dVar13 = dVar14;
    iVar12 = offset[3];
    if (uVar10 < uVar5) {
      iVar12 = *piVar7 + -1;
    }
    dVar2 = *(double *)(piVar7 + -2);
    dVar14 = (double)((iVar12 - piVar7[-4]) + 1) * dVar2 + dVar13;
    piVar7 = piVar7 + -4;
    uVar10 = uVar10 - 1;
  } while (dVar14 <= tailCutoff);
  this_00 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->_vptr_HistogramBasedDistribution = (_func_int **)this_00;
  iVar8 = iVar11;
  do {
    lVar9 = (long)(int)local_50;
    local_50 = local_50 + 1;
    uVar10 = (ulong)(int)local_50;
    while( true ) {
      if (iVar12 - (int)((tailCutoff - dVar13) / dVar2) < iVar8) goto LAB_00192f54;
      lVar3 = *(long *)(offset + 4);
      uVar5 = *(long *)(offset + 6) - lVar3 >> 4;
      if (uVar10 < uVar5) {
        iVar6 = *(int *)(lVar3 + uVar10 * 0x10) + -1;
      }
      else {
        iVar6 = offset[3];
      }
      if (iVar6 < iVar8) break;
      std::vector<double,_std::allocator<double>_>::push_back
                (this_00,(value_type_conflict4 *)(lVar3 + lVar9 * 0x10 + 8));
      iVar8 = iVar8 + 1;
    }
  } while (uVar10 < uVar5);
LAB_00192f54:
  *in_RDX = iVar11;
  return (__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<std::vector<double> > HistogramBasedDistribution::toDistribution(double tailCutoff, int* offset) const {
	// determine start point
	int min_insert_length = min;
	int min_idx = -1;
	double p_sum = 0.0;
	for (size_t i=0; i<values.size(); ++i) {
		int start = values[i].first;
		int end = (i+1 < values.size())? values[i+1].first-1:max;
		int length = end - start + 1;
		double p = values[i].second * length;
		if (p_sum + p > tailCutoff) {
			min_insert_length = start + int((tailCutoff - p_sum) / values[i].second);
			min_idx = i;
			break;
		}
		p_sum += p;
	}
	// determine end point
	int max_insert_length = max;
	p_sum = 0.0;
	for (size_t i=values.size()-1; i>=0; --i) {
		int start = values[i].first;
		int end = (i+1 < values.size())? values[i+1].first-1:max;
		int length = end - start + 1;
		double p = values[i].second * length;
		if (p_sum + p > tailCutoff) {
			max_insert_length = end - int((tailCutoff - p_sum) / values[i].second);
			break;
		}
		p_sum += p;
	}
	// create result
	unique_ptr<vector<double> > result(new vector<double>());
	int k = min_idx;
	int i = min_insert_length;
	while (i <= max_insert_length) {
		int start = values[k].first;
		int end = (k+1 < values.size())? values[k+1].first-1:max;
		assert(start <= i);
		if (i > end) {
			k += 1;
			if (k >= values.size()) break;
			else continue;
		}
		result->push_back(values[k].second);
		i += 1;
	}
	*offset = min_insert_length;
	return result;
}